

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O1

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,MultiFab *mf,int mf_start,int bnd_start,int num_comp,
          IntVect *ref_ratio,BCRec *bc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer ppFVar12;
  Box *pBVar13;
  FArrayBox *pFVar14;
  FArrayBox *pFVar15;
  int iVar16;
  int iVar17;
  Box *pBVar18;
  int dir;
  int *piVar19;
  long lVar20;
  int iVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  MFIter mfi;
  long local_178;
  long local_158;
  Box local_ac;
  MFIter local_90;
  
  uVar31 = (ulong)(uint)bnd_start;
  if (0 < num_comp) {
    do {
      (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])
                (this,bc,ref_ratio,uVar31);
      uVar33 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar33;
    } while ((int)uVar33 < num_comp + bnd_start);
  }
  local_ac.smallend.vect[0]._0_1_ = 0;
  local_ac.smallend.vect[1] = Gpu::Device::max_gpu_streams;
  local_ac.smallend.vect[2] = 0;
  local_ac.bigend.vect[0] = 0;
  local_ac.bigend.vect[1] = 0;
  local_ac.smallend.vect[0]._1_2_ = 0x101;
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,(MFItInfo *)&local_ac);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      BATransformer::operator()
                (&local_ac,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      ppFVar12 = (mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      uVar31 = 0;
      do {
        uVar33 = (int)uVar31 + (int)((uVar31 & 0xffffffff) / 3) * -3;
        uVar30 = (ulong)(uVar33 * 4);
        pBVar18 = &local_ac;
        if (2 < uVar31) {
          pBVar18 = (Box *)&local_ac.bigend;
        }
        pBVar13 = (Box *)&(this->super_BndryData).geom.domain.bigend;
        if (2 >= uVar31) {
          pBVar13 = &(this->super_BndryData).geom.domain;
        }
        if ((*(int *)((long)(pBVar18->smallend).vect + uVar30) ==
             *(int *)((long)(pBVar13->smallend).vect + uVar30)) &&
           (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx +
                     (ulong)uVar33 + 0x19) == '\0')) {
          piVar19 = &local_90.currentIndex;
          if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar19 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_90.currentIndex;
          }
          piVar22 = &local_90.currentIndex;
          if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar22 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_90.currentIndex;
          }
          if (0 < num_comp) {
            pFVar14 = (this->super_BndryData).super_BndryRegister.bndry[uVar31].m_mf.
                      super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar19];
            pFVar15 = ppFVar12[*piVar22];
            iVar1 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[0];
            iVar2 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[1];
            iVar3 = (pFVar14->super_BaseFab<double>).domain.smallend.vect[2];
            iVar4 = (pFVar14->super_BaseFab<double>).domain.bigend.vect[0];
            iVar5 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[0];
            iVar6 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[1];
            iVar7 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[2];
            iVar8 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[0];
            iVar9 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[2];
            iVar10 = (pFVar14->super_BaseFab<double>).domain.bigend.vect[2];
            if (iVar9 < iVar10) {
              iVar10 = iVar9;
            }
            iVar9 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[1];
            iVar11 = (pFVar14->super_BaseFab<double>).domain.bigend.vect[1];
            if (iVar9 < iVar11) {
              iVar11 = iVar9;
            }
            iVar9 = iVar4;
            if (iVar8 < iVar4) {
              iVar9 = iVar8;
            }
            lVar27 = (long)(((pFVar15->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1);
            iVar16 = iVar3;
            if (iVar3 < iVar7) {
              iVar16 = iVar7;
            }
            iVar17 = iVar2;
            if (iVar2 < iVar6) {
              iVar17 = iVar6;
            }
            iVar21 = iVar1;
            if (iVar1 < iVar5) {
              iVar21 = iVar5;
            }
            lVar34 = (long)iVar16;
            lVar38 = (long)(((pFVar15->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1);
            lVar24 = (long)iVar17;
            lVar20 = (long)((iVar8 - iVar5) + 1);
            local_158 = (((long)mf_start * 8 * lVar27 + lVar34 * 8 + (long)iVar7 * -8) * lVar38 +
                         lVar24 * 8 + (long)iVar6 * -8) * lVar20 + (long)iVar21 * 8 +
                        (long)iVar5 * -8 + (long)(pFVar15->super_BaseFab<double>).dptr;
            lVar26 = (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
            lVar28 = (long)(((pFVar14->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
            lVar35 = (long)((iVar4 - iVar1) + 1);
            local_178 = (((long)bnd_start * 8 * lVar26 + lVar34 * 8 + (long)iVar3 * -8) * lVar28 +
                         lVar24 * 8 + (long)iVar2 * -8) * lVar35 + (long)iVar21 * 8 +
                        (long)iVar1 * -8 + (long)(pFVar14->super_BaseFab<double>).dptr;
            lVar38 = lVar38 * lVar20 * 8;
            lVar28 = lVar28 * lVar35 * 8;
            uVar30 = 0;
            do {
              lVar23 = local_158;
              lVar32 = local_178;
              lVar37 = lVar34;
              if (iVar16 <= iVar10) {
                do {
                  lVar29 = lVar32;
                  lVar36 = lVar23;
                  lVar39 = lVar24;
                  if (iVar17 <= iVar11) {
                    do {
                      if (iVar21 <= iVar9) {
                        lVar25 = 0;
                        do {
                          *(undefined8 *)(lVar29 + lVar25 * 8) =
                               *(undefined8 *)(lVar36 + lVar25 * 8);
                          lVar25 = lVar25 + 1;
                        } while ((iVar9 - iVar21) + 1 != (int)lVar25);
                      }
                      lVar39 = lVar39 + 1;
                      lVar36 = lVar36 + lVar20 * 8;
                      lVar29 = lVar29 + lVar35 * 8;
                    } while (iVar11 + 1 != (int)lVar39);
                  }
                  lVar37 = lVar37 + 1;
                  lVar23 = lVar23 + lVar38;
                  lVar32 = lVar32 + lVar28;
                } while (iVar10 + 1 != (int)lVar37);
              }
              uVar30 = uVar30 + 1;
              local_158 = local_158 + lVar27 * lVar38;
              local_178 = local_178 + lVar26 * lVar28;
            } while (uVar30 != (uint)num_comp);
          }
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != 6);
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (const MultiFab& mf,
                                 int             mf_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 const IntVect&  ref_ratio,
                                 const BCRec&    bc)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(grids == mf.boxArray());

    for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
        setBndryConds(bc, ref_ratio, n);
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,MFItInfo().SetDynamic(true)); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();

        for (OrientationIter fi; fi; ++fi)
        {
            const Orientation face = fi();

            if (bx[face]==geom.Domain()[face] && !geom.isPeriodic(face.coordDir()))
            {
                //
                // Physical bndry, copy from grid.
                //
                auto& bnd_fab = bndry[face][mfi];
                auto const& src_fab = mf[mfi];
                auto bnd_array = bnd_fab.array();
                auto const src_array = src_fab.array();
                const Box& b = src_fab.box() & bnd_fab.box();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( b, num_comp, i, j, k, n,
                {
                    bnd_array(i,j,k,n+bnd_start) = src_array(i,j,k,n+mf_start);
                });
            }
        }
    }
}